

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

fields absl::lts_20240722::time_internal::cctz::detail::impl::n_mon
                 (year_t y,diff_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  long lVar1;
  fields fVar2;
  
  if (m == 0xc) {
    lVar1 = 0xc;
  }
  else {
    lVar1 = m % 0xc;
    y = y + m / 0xc;
    if (lVar1 < 1) {
      y = y + -1;
      lVar1 = lVar1 + 0xc;
    }
  }
  fVar2 = n_day(y,(month_t)lVar1,d,cd,hh,mm,ss);
  fVar2._8_8_ = fVar2._8_8_ & 0xffffffffff;
  return fVar2;
}

Assistant:

CONSTEXPR_F fields n_mon(year_t y, diff_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  if (m != 12) {
    y += m / 12;
    m %= 12;
    if (m <= 0) {
      y -= 1;
      m += 12;
    }
  }
  return n_day(y, static_cast<month_t>(m), d, cd, hh, mm, ss);
}